

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,uint C2)

{
  undefined2 local_3a;
  RegSlot local_38;
  undefined1 auStack_34 [2];
  OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  local_3a = 10;
  local_38 = R1;
  _auStack_34 = C2;
  Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,&local_3a,10);
  AddJumpOffset(this,op,labelID,10);
  return true;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg1Unsigned1(OpCode op, ByteCodeLabel labelID, RegSlot R1, uint C2)
    {
        OpLayoutT_BrReg1Unsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.C2, C2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }